

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O3

void adjust_rdcost(AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_cost)

{
  long lVar1;
  int64_t *in_R8;
  int64_t rec_var;
  int64_t src_var;
  long local_30;
  long local_28;
  
  if ((((cpi->oxcf).algo_cfg.sharpness == 3) &&
      (((cpi->common).current_frame.frame_type & 0xfd) != 0)) &&
     (((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 2)) {
    get_variance_stats(cpi,x,(int)&local_28,&local_30,in_R8);
    if (local_28 - local_30 != 0 && local_30 <= local_28) {
      lVar1 = (local_28 - local_30) + rd_cost->dist;
      rd_cost->dist = lVar1;
      rd_cost->rdcost = lVar1 * 0x80 + ((long)x->rdmult * (long)rd_cost->rate + 0x100 >> 9);
    }
  }
  return;
}

Assistant:

static void adjust_rdcost(const AV1_COMP *cpi, const MACROBLOCK *x,
                          RD_STATS *rd_cost) {
  if (cpi->oxcf.algo_cfg.sharpness != 3) return;

  if (frame_is_kf_gf_arf(cpi)) return;

  int64_t src_var, rec_var;
  get_variance_stats(cpi, x, 1, &src_var, &rec_var);

  if (src_var <= rec_var) return;

  int64_t var_offset = src_var - rec_var;

  rd_cost->dist += var_offset;

  rd_cost->rdcost = RDCOST(x->rdmult, rd_cost->rate, rd_cost->dist);
}